

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piecewise_linear.cpp
# Opt level: O1

void __thiscall
mp::
BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::TanId>_>
::ClipFuncGraphDomain
          (BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::TanId>_>
           *this)

{
  double *args_1;
  char *pcVar1;
  double dVar2;
  PLApproxParams *pPVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  Error *this_00;
  undefined4 extraout_var;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar7;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar8;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  Range rngAcc;
  double *args_4;
  double local_58;
  string local_50;
  undefined8 local_30;
  
  (*this->_vptr_BasicPLApproximator[3])();
  args_4 = (double *)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
  pPVar3 = this->laPrm_;
  args_1 = &(pPVar3->grDom).ubx;
  if (((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) <= (double)(pPVar3->grDom).lbx) &&
     (*args_1 <= (double)CONCAT44(in_XMM1_Db,in_XMM1_Da))) {
    (*this->_vptr_BasicPLApproximator[4])(&local_50,this);
    uVar7 = SUB84(local_50._M_dataplus._M_p,0);
    uVar8 = (undefined4)((ulong)local_50._M_dataplus._M_p >> 0x20);
    pcVar1 = (char *)(pPVar3->grDom).lbx;
    if ((double)local_50._M_dataplus._M_p <= (double)pcVar1) {
      uVar7 = SUB84(pcVar1,0);
      uVar8 = (undefined4)((ulong)pcVar1 >> 0x20);
    }
    (pPVar3->grDom).lbx = (double)CONCAT44(uVar8,uVar7);
    uVar7 = (undefined4)local_50._M_string_length;
    uVar8 = (undefined4)(local_50._M_string_length >> 0x20);
    dVar2 = (pPVar3->grDom).ubx;
    if (dVar2 <= (double)local_50._M_string_length) {
      uVar7 = SUB84(dVar2,0);
      uVar8 = (undefined4)((ulong)dVar2 >> 0x20);
    }
    (pPVar3->grDom).ubx = (double)CONCAT44(uVar8,uVar7);
    uVar7 = (undefined4)local_50.field_2._M_allocated_capacity;
    uVar8 = (undefined4)((ulong)local_50.field_2._0_8_ >> 0x20);
    dVar2 = (pPVar3->grDom).lby;
    if ((double)local_50.field_2._M_allocated_capacity <= dVar2) {
      uVar7 = SUB84(dVar2,0);
      uVar8 = (undefined4)((ulong)dVar2 >> 0x20);
    }
    (pPVar3->grDom).lby = (double)CONCAT44(uVar8,uVar7);
    uVar7 = (undefined4)local_50.field_2._8_8_;
    uVar8 = (undefined4)((ulong)local_50.field_2._8_8_ >> 0x20);
    dVar2 = (pPVar3->grDom).uby;
    if (dVar2 <= (double)local_50.field_2._8_8_) {
      uVar7 = SUB84(dVar2,0);
      uVar8 = (undefined4)((ulong)dVar2 >> 0x20);
    }
    (pPVar3->grDom).uby = (double)CONCAT44(uVar8,uVar7);
    iVar6 = (*this->_vptr_BasicPLApproximator[5])(this);
    if ((char)iVar6 != '\0') {
      (*this->_vptr_BasicPLApproximator[0x1e])(this,this->laPrm_);
    }
    this->lbx_ = (double)(pPVar3->grDom).lbx;
    this->ubx_ = (pPVar3->grDom).ubx;
    pPVar3 = this->laPrm_;
    dVar2 = (pPVar3->grDom).lbx;
    dVar4 = (pPVar3->grDom).ubx;
    dVar5 = (pPVar3->grDom).uby;
    (pPVar3->grDomOut).lby = (pPVar3->grDom).lby;
    (pPVar3->grDomOut).uby = dVar5;
    (pPVar3->grDomOut).lbx = dVar2;
    (pPVar3->grDomOut).ubx = dVar4;
    return;
  }
  this_00 = (Error *)__cxa_allocate_exception(0x18);
  iVar6 = (*this->_vptr_BasicPLApproximator[2])(this);
  local_30 = CONCAT44(extraout_var,iVar6);
  fmt::format<char_const*,double,double,double,double>
            (&local_50,
             (fmt *)"PLApproximator<{}>: argument range [{}, {}] outside of the accepted [{}, {}]",
             (CStringRef)&local_30,(char **)pPVar3,args_1,(double *)&stack0xffffffffffffffa0,
             &local_58,args_4);
  Error::Error(this_00,(CStringRef)local_50._M_dataplus._M_p,-1);
  __cxa_throw(this_00,&Error::typeinfo,fmt::SystemError::~SystemError);
}

Assistant:

virtual void ClipFuncGraphDomain() {
    auto rngAcc = GetLargestAcceptedArgumentRange();
    auto& lbx = laPrm_.grDom.lbx;
    auto& ubx = laPrm_.grDom.ubx;
    MP_ASSERT_ALWAYS(lbx >= rngAcc.lb && rngAcc.ub >= ubx,
                     fmt::format(
                       "PLApproximator<{}>: argument range "
                       "[{}, {}] outside of the accepted [{}, {}]",
                       GetConTypeName(),
                       lbx, ubx, rngAcc.lb, rngAcc.ub));
    laPrm_.grDom.intersect(GetFuncGraphDomain());
    if (IsMonotone())     // TODO in the reduced domain only
      ClipWithFunctionValues(laPrm_.grDom);
    lbx_ = lbx;
    ubx_ = ubx;
    laPrm_.grDomOut = laPrm_.grDom;        // communicate new domain
  }